

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O1

void stbtt_Rasterize(stbtt__bitmap *result,float flatness_in_pixels,stbtt_vertex *vertices,
                    int num_verts,float scale_x,float scale_y,float shift_x,float shift_y,int x_off,
                    int y_off,int invert,void *userdata)

{
  stbtt__edge *psVar1;
  short sVar2;
  short sVar3;
  bool bVar4;
  float *__s;
  int iVar5;
  stbtt__active_edge *z;
  ulong uVar6;
  stbtt__edge *psVar7;
  float *scanline;
  undefined1 auVar8 [8];
  undefined8 *puVar9;
  uchar uVar10;
  long lVar11;
  ulong uVar12;
  stbtt__active_edge *psVar13;
  uint uVar14;
  int iVar15;
  size_t __size;
  undefined4 in_register_00000084;
  int iVar16;
  stbtt__active_edge *psVar17;
  int iVar18;
  int iVar19;
  stbtt__active_edge *psVar20;
  undefined8 *puVar21;
  void *unaff_R13;
  int iVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  uint in_XMM2_Db;
  uint uVar28;
  uint in_XMM2_Dc;
  uint uVar29;
  uint in_XMM2_Dd;
  uint uVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  undefined8 local_318;
  int num_points;
  ulong local_110;
  float *local_108;
  stbtt__edge *local_100;
  undefined1 local_f8 [16];
  float local_dc;
  float *local_d8;
  stbtt__point *local_d0;
  undefined8 *local_c8;
  void *local_c0;
  ulong local_b8;
  stbtt__bitmap *local_b0;
  undefined1 local_a8 [16];
  ulong local_90;
  undefined1 local_88 [8];
  stbtt__active_edge *active;
  float local_74;
  stbtt__edge *local_70;
  float local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  int local_4c;
  stbtt_vertex *local_48;
  float local_40;
  float local_3c;
  float local_38;
  float y0;
  
  local_b8 = CONCAT44(in_register_00000084,y_off);
  local_f8._0_4_ = x_off;
  active = (stbtt__active_edge *)CONCAT44(active._4_4_,shift_y);
  local_318 = local_318 & 0xffffffff00000000;
  if (num_verts < 1) {
    uVar12 = 0;
  }
  else {
    lVar11 = 0;
    uVar12 = 0;
    do {
      uVar12 = (ulong)((int)uVar12 + (uint)((&vertices->type)[lVar11] == '\x01'));
      lVar11 = lVar11 + 10;
    } while ((ulong)(uint)num_verts * 10 != lVar11);
  }
  local_b0 = result;
  local_74 = shift_x;
  local_68 = scale_y;
  uStack_64 = in_XMM2_Db;
  uStack_60 = in_XMM2_Dc;
  uStack_5c = in_XMM2_Dd;
  local_40 = (float)invert;
  local_3c = scale_x;
  local_38 = flatness_in_pixels;
  y0 = (float)num_verts;
  if ((int)uVar12 != 0) {
    unaff_R13 = malloc((long)(int)uVar12 << 2);
    if (unaff_R13 != (void *)0x0) {
      fVar24 = local_68;
      if (local_3c <= local_68) {
        fVar24 = local_3c;
      }
      local_38 = (local_38 / fVar24) * (local_38 / fVar24);
      uVar6 = 0;
      fVar24 = 0.0;
      local_d0 = (stbtt__point *)0x0;
      fVar27 = local_68;
      uVar28 = uStack_64;
      uVar29 = uStack_60;
      uVar30 = uStack_5c;
      local_c0 = unaff_R13;
      local_90 = uVar12;
      local_48 = vertices;
      do {
        if ((int)uVar6 == 0) {
LAB_0010bc16:
          local_318 = local_318 & 0xffffffff00000000;
          if ((int)y0 < 1) {
            lVar11 = -1;
          }
          else {
            local_a8._0_8_ = uVar6;
            uVar14 = 0xffffffff;
            fVar25 = 0.0;
            lVar11 = 0;
            fVar23 = 0.0;
            do {
              uVar10 = (&vertices->type)[lVar11];
              if (uVar10 == '\x03') {
                stbtt__tesselate_curve
                          (local_d0,(int *)&local_318,fVar23,fVar25,
                           (float)(int)*(short *)((long)&vertices->cx + lVar11),
                           (float)(int)*(short *)((long)&vertices->cy + lVar11),
                           (float)(int)*(short *)((long)&vertices->x + lVar11),
                           (float)(int)*(short *)((long)&vertices->y + lVar11),local_38,0);
                fVar23 = (float)(int)*(short *)((long)&local_48->x + lVar11);
                fVar25 = (float)(int)*(short *)((long)&local_48->y + lVar11);
                vertices = local_48;
                fVar27 = local_68;
                uVar28 = uStack_64;
                uVar29 = uStack_60;
                uVar30 = uStack_5c;
                uVar12 = local_318;
              }
              else {
                if (uVar10 == '\x02') {
                  sVar2 = *(short *)((long)&vertices->x + lVar11);
                  sVar3 = *(short *)((long)&vertices->y + lVar11);
                }
                else {
                  uVar12 = local_318;
                  if (uVar10 != '\x01') goto LAB_0010bd6a;
                  if (-1 < (int)uVar14) {
                    *(int *)((long)local_c0 + (ulong)uVar14 * 4) =
                         (int)(float)local_318 - (int)fVar24;
                  }
                  uVar14 = uVar14 + 1;
                  sVar2 = *(short *)((long)&vertices->x + lVar11);
                  sVar3 = *(short *)((long)&vertices->y + lVar11);
                  fVar24 = (float)local_318;
                }
                uVar12 = CONCAT44(local_318._4_4_,(int)(float)local_318 + 1);
                fVar25 = (float)(int)sVar3;
                fVar23 = (float)(int)sVar2;
                if (local_d0 != (stbtt__point *)0x0) {
                  local_d0[(int)(float)local_318].x = fVar23;
                  local_d0[(int)(float)local_318].y = fVar25;
                }
              }
LAB_0010bd6a:
              local_318 = uVar12;
              lVar11 = lVar11 + 10;
            } while ((ulong)(uint)num_verts * 10 != lVar11);
            lVar11 = (long)(int)uVar14;
            uVar6 = local_a8._0_8_;
            unaff_R13 = local_c0;
          }
          *(int *)((long)unaff_R13 + lVar11 * 4) = (int)(float)local_318 - (int)fVar24;
          bVar4 = true;
        }
        else {
          local_d0 = (stbtt__point *)malloc((long)(int)(float)local_318 << 3);
          fVar27 = local_68;
          uVar28 = uStack_64;
          uVar29 = uStack_60;
          uVar30 = uStack_5c;
          if (local_d0 != (stbtt__point *)0x0) goto LAB_0010bc16;
          local_d0 = (stbtt__point *)0x0;
          bVar4 = false;
        }
        if (!bVar4) {
          free(local_d0);
          free(unaff_R13);
          unaff_R13 = (void *)0x0;
          local_d0 = (stbtt__point *)0x0;
          uVar12 = 0;
          fVar27 = local_68;
          uVar28 = uStack_64;
          uVar29 = uStack_60;
          uVar30 = uStack_5c;
          break;
        }
        iVar15 = (int)uVar6;
        uVar6 = (ulong)(iVar15 + 1);
        uVar12 = local_90;
      } while (iVar15 == 0);
      goto LAB_0010bde6;
    }
    uVar12 = 0;
  }
  local_d0 = (stbtt__point *)0x0;
  fVar27 = local_68;
  uVar28 = uStack_64;
  uVar29 = uStack_60;
  uVar30 = uStack_5c;
LAB_0010bde6:
  if (local_d0 != (stbtt__point *)0x0) {
    if (local_40 != 0.0) {
      fVar27 = -fVar27;
      uVar28 = uVar28 ^ 0x80000000;
      uVar29 = uVar29 ^ 0x80000000;
      uVar30 = uVar30 ^ 0x80000000;
    }
    if ((int)uVar12 < 1) {
      __size = 0x14;
    }
    else {
      uVar6 = 0;
      lVar11 = 0;
      do {
        lVar11 = (long)(int)lVar11 + (long)*(int *)((long)unaff_R13 + uVar6 * 4);
        uVar6 = uVar6 + 1;
      } while ((uVar12 & 0xffffffff) != uVar6);
      __size = lVar11 * 0x14 + 0x14;
    }
    local_68 = fVar27;
    uStack_64 = uVar28;
    uStack_60 = uVar29;
    uStack_5c = uVar30;
    psVar7 = (stbtt__edge *)malloc(__size);
    if (psVar7 != (stbtt__edge *)0x0) {
      if ((int)uVar12 < 1) {
        uVar28 = 0;
      }
      else {
        uVar6 = 0;
        uVar28 = 0;
        iVar15 = 0;
        do {
          iVar5 = *(int *)((long)unaff_R13 + uVar6 * 4);
          if (0 < (long)iVar5) {
            lVar11 = 0;
            iVar18 = iVar5 + -1;
            do {
              fVar24 = local_d0[(long)iVar15 + (long)iVar18].y;
              fVar27 = local_d0[iVar15 + lVar11].y;
              iVar16 = (int)lVar11;
              if ((fVar24 != fVar27) || (NAN(fVar24) || NAN(fVar27))) {
                psVar1 = psVar7 + (int)uVar28;
                psVar7[(int)uVar28].invert = 0;
                iVar19 = iVar18;
                iVar22 = iVar16;
                if (local_40 == 0.0) {
                  if (fVar24 < fVar27) goto LAB_0010bed9;
                }
                else if (fVar27 < fVar24) {
LAB_0010bed9:
                  psVar1->invert = 1;
                  iVar19 = iVar16;
                  iVar22 = iVar18;
                }
                psVar1->x0 = local_d0[(long)iVar15 + (long)iVar22].x * local_3c + local_74;
                psVar1->y0 = local_d0[(long)iVar15 + (long)iVar22].y * local_68 + active._0_4_;
                psVar1->x1 = local_d0[(long)iVar15 + (long)iVar19].x * local_3c + local_74;
                psVar1->y1 = local_d0[(long)iVar15 + (long)iVar19].y * local_68 + active._0_4_;
                uVar28 = uVar28 + 1;
              }
              lVar11 = lVar11 + 1;
              iVar18 = iVar16;
            } while (iVar5 != lVar11);
          }
          iVar15 = iVar5 + iVar15;
          uVar6 = uVar6 + 1;
        } while (uVar6 != (uVar12 & 0xffffffff));
      }
      stbtt__sort_edges_quicksort(psVar7,uVar28);
      if (1 < (int)uVar28) {
        uVar12 = 1;
        do {
          fVar24 = psVar7[uVar12].x0;
          fVar27 = psVar7[uVar12].y0;
          num_points = psVar7[uVar12].invert;
          local_318._0_4_ = psVar7[uVar12].x1;
          local_318._4_4_ = psVar7[uVar12].y1;
          uVar6 = uVar12 & 0xffffffff;
          do {
            uVar29 = (uint)uVar6;
            if ((int)uVar29 < 1) break;
            fVar23 = psVar7[uVar6 - 1].y0;
            if (fVar27 < fVar23) {
              psVar1 = psVar7 + uVar6;
              psVar1->invert = psVar1[-1].invert;
              fVar25 = psVar1[-1].y0;
              fVar26 = psVar1[-1].x1;
              fVar31 = psVar1[-1].y1;
              psVar1->x0 = psVar1[-1].x0;
              psVar1->y0 = fVar25;
              psVar1->x1 = fVar26;
              psVar1->y1 = fVar31;
              uVar6 = (ulong)(uVar29 - 1);
            }
            uVar29 = (uint)uVar6;
          } while (fVar27 < fVar23);
          if (uVar12 != uVar29) {
            psVar7[(int)uVar29].x0 = fVar24;
            psVar7[(int)uVar29].y0 = fVar27;
            psVar7[(int)uVar29].x1 = (float)local_318;
            psVar7[(int)uVar29].y1 = (float)local_318._4_4_;
            psVar7[(int)uVar29].invert = num_points;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar28);
      }
      local_88 = (undefined1  [8])0x0;
      uVar29 = local_b0->w;
      local_100 = psVar7;
      if ((int)uVar29 < 0x41) {
        scanline = (float *)&local_318;
      }
      else {
        scanline = (float *)malloc((ulong)uVar29 * 8 + 4);
      }
      iVar15 = local_b0->h;
      local_100[(int)uVar28].y0 = (float)(iVar15 + (int)local_b8) + 1.0;
      uVar12 = 0;
      if (iVar15 < 1) {
        puVar21 = (undefined8 *)0x0;
      }
      else {
        local_d8 = scanline + (int)uVar29;
        local_dc = (float)(int)local_f8._0_4_;
        local_108 = local_d8 + 1;
        local_c8 = (undefined8 *)0x0;
        local_4c = 0;
        psVar17 = (stbtt__active_edge *)0x0;
        uVar6 = local_b8;
        local_70 = local_100;
        local_c0 = unaff_R13;
        do {
          __s = local_d8;
          local_3c = (float)(int)uVar6;
          y0 = local_3c + 1.0;
          psVar20 = (stbtt__active_edge *)(long)local_b0->w;
          local_b8 = uVar6;
          memset(scanline,0,(long)psVar20 * 4);
          active = psVar20;
          memset(__s,0,(long)psVar20 * 4 + 4);
          fVar24 = local_3c;
          psVar7 = local_70;
          if (local_88 != (undefined1  [8])0x0) {
            auVar8 = local_88;
            psVar20 = (stbtt__active_edge *)local_88;
            do {
              psVar13 = (stbtt__active_edge *)auVar8;
              if (((stbtt__active_edge *)auVar8)->ey <= fVar24) {
                psVar20->next = ((stbtt__active_edge *)auVar8)->next;
                if ((((stbtt__active_edge *)auVar8)->direction == 0.0) &&
                   (!NAN(((stbtt__active_edge *)auVar8)->direction))) {
                  __assert_fail("z->direction",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                                ,0x843,
                                "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                               );
                }
                ((stbtt__active_edge *)auVar8)->direction = 0.0;
                ((stbtt__active_edge *)auVar8)->next = psVar17;
                psVar13 = psVar20;
                psVar17 = (stbtt__active_edge *)auVar8;
              }
              auVar8 = (undefined1  [8])psVar13->next;
              psVar20 = psVar13;
            } while (auVar8 != (undefined1  [8])0x0);
          }
          fVar27 = psVar7->y0;
          puVar21 = local_c8;
          while (fVar27 <= y0) {
            fVar23 = psVar7->y1;
            psVar20 = psVar17;
            if ((fVar27 != fVar23) || (NAN(fVar27) || NAN(fVar23))) {
              if (psVar17 == (stbtt__active_edge *)0x0) {
                puVar9 = puVar21;
                if (local_4c == 0) {
                  local_70 = psVar7;
                  local_68 = fVar23;
                  local_40 = fVar27;
                  puVar9 = (undefined8 *)malloc(0x6408);
                  psVar7 = local_70;
                  fVar24 = local_3c;
                  fVar27 = local_40;
                  fVar23 = local_68;
                  if (puVar9 == (undefined8 *)0x0) {
                    psVar17 = (stbtt__active_edge *)0x0;
                    goto LAB_0010c296;
                  }
                  *puVar9 = puVar21;
                  local_4c = 800;
                }
                lVar11 = (long)local_4c;
                local_4c = local_4c + -1;
                psVar17 = (stbtt__active_edge *)(puVar9 + lVar11 * 4 + -4);
                puVar21 = puVar9;
              }
              else {
                psVar20 = psVar17->next;
              }
LAB_0010c296:
              if (psVar17 == (stbtt__active_edge *)0x0) {
                __assert_fail("z != __null",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                              ,0x6b2,
                              "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                             );
              }
              fVar25 = psVar7->x0;
              fVar26 = (psVar7->x1 - fVar25) / (fVar23 - fVar27);
              psVar17->fdx = fVar26;
              psVar17->fdy = (float)(-(uint)(fVar26 != 0.0) & (uint)(1.0 / fVar26));
              psVar17->fx = ((fVar24 - fVar27) * fVar26 + fVar25) - local_dc;
              psVar17->direction = *(float *)(&DAT_00117248 + (ulong)(psVar7->invert == 0) * 4);
              psVar17->sy = fVar27;
              psVar17->ey = fVar23;
              psVar17->next = (stbtt__active_edge *)0x0;
              if (fVar23 < fVar24) {
                __assert_fail("z->ey >= scan_y_top",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                              ,0x850,
                              "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                             );
              }
              psVar17->next = (stbtt__active_edge *)local_88;
              local_88 = (undefined1  [8])psVar17;
            }
            psVar1 = psVar7 + 1;
            psVar7 = psVar7 + 1;
            psVar17 = psVar20;
            fVar27 = psVar1->y0;
          }
          local_70 = psVar7;
          local_c8 = puVar21;
          local_110 = uVar12;
          if (local_88 != (undefined1  [8])0x0) {
            local_90 = CONCAT44(local_90._4_4_,(float)(int)active._0_4_);
            auVar8 = local_88;
            do {
              fVar27 = ((stbtt__active_edge *)auVar8)->ey;
              if (fVar27 < fVar24) {
                __assert_fail("e->ey >= y_top",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                              ,0x786,
                              "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                             );
              }
              fVar23 = ((stbtt__active_edge *)auVar8)->fx;
              fVar25 = ((stbtt__active_edge *)auVar8)->fdx;
              if ((fVar25 != 0.0) || (NAN(fVar25))) {
                fVar26 = ((stbtt__active_edge *)auVar8)->sy;
                if (y0 < fVar26) {
                  __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                                ,0x799,
                                "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                               );
                }
                fVar34 = fVar25 + fVar23;
                fVar31 = (float)(~-(uint)(fVar24 < fVar26) & (uint)fVar23 |
                                (uint)((fVar26 - fVar24) * fVar25 + fVar23) &
                                -(uint)(fVar24 < fVar26));
                if ((((fVar31 < 0.0) ||
                     (fVar33 = (float)(~-(uint)(fVar27 < y0) & (uint)fVar34 |
                                      (uint)((fVar27 - fVar24) * fVar25 + fVar23) &
                                      -(uint)(fVar27 < y0)), fVar33 < 0.0)) ||
                    ((float)local_90 <= fVar31)) || ((float)local_90 <= fVar33)) {
                  if (0 < (int)active._0_4_) {
                    local_f8 = ZEXT416((uint)fVar23);
                    local_a8 = ZEXT416((uint)fVar34);
                    local_74 = fVar25;
                    iVar15 = 0;
                    do {
                      local_68 = (float)iVar15;
                      iVar5 = iVar15 + 1;
                      fVar27 = (float)iVar5;
                      local_40 = (local_68 - fVar23) / local_74 + fVar24;
                      fVar25 = (fVar27 - fVar23) / local_74 + fVar24;
                      if ((local_68 <= fVar23) || (fVar34 <= fVar27)) {
                        if ((fVar34 < local_68) && (fVar27 < fVar23)) {
                          local_48 = (stbtt_vertex *)CONCAT44(local_48._4_4_,fVar27);
                          local_38 = fVar25;
                          stbtt__handle_clipped_edge
                                    (scanline,iVar15,(stbtt__active_edge *)auVar8,fVar23,fVar24,
                                     fVar27,fVar25);
                          fVar23 = local_48._0_4_;
                          fVar24 = local_38;
LAB_0010c670:
                          stbtt__handle_clipped_edge
                                    (scanline,iVar15,(stbtt__active_edge *)auVar8,fVar23,fVar24,
                                     local_68,local_40);
                          fVar23 = local_68;
                          fVar24 = local_40;
                          goto LAB_0010c687;
                        }
                        if (((fVar23 < local_68) && (local_68 < fVar34)) ||
                           ((fVar34 < local_68 && (local_68 < fVar23)))) goto LAB_0010c670;
                        if (((fVar23 < fVar27) && (fVar27 < fVar34)) ||
                           ((fVar34 < fVar27 && (fVar27 < fVar23)))) {
                          local_48 = (stbtt_vertex *)CONCAT44(local_48._4_4_,fVar27);
                          local_38 = fVar25;
                          goto LAB_0010c5da;
                        }
                      }
                      else {
                        local_48 = (stbtt_vertex *)CONCAT44(local_48._4_4_,fVar27);
                        local_38 = fVar25;
                        stbtt__handle_clipped_edge
                                  (scanline,iVar15,(stbtt__active_edge *)auVar8,fVar23,fVar24,
                                   local_68,local_40);
                        fVar23 = local_68;
                        fVar24 = local_40;
                        fVar27 = local_48._0_4_;
LAB_0010c5da:
                        stbtt__handle_clipped_edge
                                  (scanline,iVar15,(stbtt__active_edge *)auVar8,fVar23,fVar24,fVar27
                                   ,local_38);
                        fVar23 = local_48._0_4_;
                        fVar24 = local_38;
LAB_0010c687:
                        fVar34 = (float)local_a8._0_4_;
                      }
                      stbtt__handle_clipped_edge
                                (scanline,iVar15,(stbtt__active_edge *)auVar8,fVar23,fVar24,fVar34,
                                 y0);
                      fVar23 = (float)local_f8._0_4_;
                      fVar34 = (float)local_a8._0_4_;
                      fVar24 = local_3c;
                      iVar15 = iVar5;
                    } while (active._0_4_ != (float)iVar5);
                  }
                }
                else {
                  if (fVar26 <= fVar24) {
                    fVar26 = fVar24;
                  }
                  uVar28 = (uint)fVar31;
                  if (y0 <= fVar27) {
                    fVar27 = y0;
                  }
                  if (uVar28 == (int)fVar33) {
                    if (((int)uVar28 < 0) || ((int)active._0_4_ <= (int)uVar28)) {
                      __assert_fail("x >= 0 && x < len",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                                    ,0x7b5,
                                    "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                   );
                    }
                    uVar12 = (ulong)uVar28;
                    scanline[uVar12] =
                         (((fVar33 - (float)(int)uVar28) + (fVar31 - (float)(int)uVar28)) * -0.5 +
                         1.0) * ((stbtt__active_edge *)auVar8)->direction * (fVar27 - fVar26) +
                         scanline[uVar12];
                    fVar23 = (fVar27 - fVar26) * ((stbtt__active_edge *)auVar8)->direction;
                  }
                  else {
                    fVar25 = ((stbtt__active_edge *)auVar8)->fdy;
                    fVar32 = fVar33;
                    if (fVar33 < fVar31) {
                      fVar23 = fVar24 - fVar26;
                      fVar26 = (fVar24 - fVar27) + y0;
                      fVar25 = -fVar25;
                      fVar27 = fVar23 + y0;
                      fVar32 = fVar31;
                      fVar23 = fVar34;
                      fVar31 = fVar33;
                    }
                    iVar5 = (int)fVar32;
                    iVar15 = (int)fVar31 + 1;
                    fVar33 = ((float)iVar15 - fVar23) * fVar25 + fVar24;
                    fVar23 = ((stbtt__active_edge *)auVar8)->direction;
                    fVar34 = (fVar33 - fVar26) * fVar23;
                    lVar11 = (long)(int)fVar31;
                    scanline[lVar11] =
                         (((fVar31 - (float)(int)fVar31) + 1.0) * -0.5 + 1.0) * fVar34 +
                         scanline[lVar11];
                    if (iVar5 - iVar15 != 0 && iVar15 <= iVar5) {
                      do {
                        scanline[lVar11 + 1] = fVar25 * fVar23 * 0.5 + fVar34 + scanline[lVar11 + 1]
                        ;
                        fVar34 = fVar34 + fVar25 * fVar23;
                        lVar11 = lVar11 + 1;
                      } while (iVar5 + -1 != (int)lVar11);
                    }
                    if (1.01 < ABS(fVar34)) {
                      __assert_fail("fabs(area) <= 1.01f",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                                    ,0x7da,
                                    "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                   );
                    }
                    uVar12 = (ulong)iVar5;
                    scanline[uVar12] =
                         (fVar27 - (fVar25 * (float)(iVar5 - iVar15) + fVar33)) *
                         (((fVar32 - (float)iVar5) + 0.0) * -0.5 + 1.0) * fVar23 + fVar34 +
                         scanline[uVar12];
                    fVar23 = (fVar27 - fVar26) * fVar23;
                  }
                  local_108[uVar12] = fVar23 + local_108[uVar12];
                }
              }
              else if (fVar23 < (float)local_90) {
                if (0.0 <= fVar23) {
                  local_f8 = ZEXT416((uint)fVar23);
                  stbtt__handle_clipped_edge
                            (scanline,(int)fVar23,(stbtt__active_edge *)auVar8,fVar23,fVar24,fVar23,
                             y0);
                  iVar15 = (int)fVar23 + 1;
                  fVar23 = (float)local_f8._0_4_;
                  fVar24 = local_3c;
                }
                else {
                  iVar15 = 0;
                }
                stbtt__handle_clipped_edge
                          (local_d8,iVar15,(stbtt__active_edge *)auVar8,fVar23,fVar24,fVar23,y0);
                fVar24 = local_3c;
              }
              auVar8 = (undefined1  [8])((stbtt__active_edge *)auVar8)->next;
            } while (auVar8 != (undefined1  [8])0x0);
          }
          auVar8 = local_88;
          if (0 < local_b0->w) {
            fVar24 = 0.0;
            lVar11 = 0;
            do {
              fVar24 = fVar24 + local_d8[lVar11];
              iVar15 = (int)(ABS(scanline[lVar11] + fVar24) * 255.0 + 0.5);
              uVar10 = (uchar)iVar15;
              if (0xfe < iVar15) {
                uVar10 = 0xff;
              }
              local_b0->pixels[lVar11 + (long)(int)local_110 * (long)local_b0->stride] = uVar10;
              lVar11 = lVar11 + 1;
            } while (lVar11 < local_b0->w);
          }
          for (; auVar8 != (undefined1  [8])0x0;
              auVar8 = (undefined1  [8])((stbtt__active_edge *)auVar8)->next) {
            ((stbtt__active_edge *)auVar8)->fx =
                 ((stbtt__active_edge *)auVar8)->fdx + ((stbtt__active_edge *)auVar8)->fx;
          }
          uVar6 = (ulong)((int)local_b8 + 1);
          uVar28 = (int)local_110 + 1;
          uVar12 = (ulong)uVar28;
          puVar21 = local_c8;
          unaff_R13 = local_c0;
        } while ((int)uVar28 < local_b0->h);
      }
      while (local_c0 = unaff_R13, puVar21 != (undefined8 *)0x0) {
        puVar9 = (undefined8 *)*puVar21;
        free(puVar21);
        puVar21 = puVar9;
        unaff_R13 = local_c0;
      }
      if (scanline != (float *)&local_318) {
        free(scanline);
      }
      free(local_100);
    }
    free(unaff_R13);
    free(local_d0);
  }
  return;
}

Assistant:

STBTT_DEF void stbtt_Rasterize(stbtt__bitmap *result, float flatness_in_pixels, stbtt_vertex *vertices, int num_verts, float scale_x, float scale_y, float shift_x, float shift_y, int x_off, int y_off, int invert, void *userdata)
{
   float scale = scale_x > scale_y ? scale_y : scale_x;
   int winding_count, *winding_lengths;
   stbtt__point *windings = stbtt_FlattenCurves(vertices, num_verts, flatness_in_pixels / scale, &winding_lengths, &winding_count, userdata);
   if (windings) {
      stbtt__rasterize(result, windings, winding_lengths, winding_count, scale_x, scale_y, shift_x, shift_y, x_off, y_off, invert, userdata);
      STBTT_free(winding_lengths, userdata);
      STBTT_free(windings, userdata);
   }
}